

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O1

REF_STATUS ref_dict_location(REF_DICT ref_dict,REF_INT key,REF_INT *location)

{
  REF_STATUS RVar1;
  long lVar2;
  
  if (10 < ref_dict->n) {
    RVar1 = ref_sort_search_int(ref_dict->n,ref_dict->key,key,location);
    return RVar1;
  }
  *location = -1;
  if (0 < (long)ref_dict->n) {
    lVar2 = 0;
    do {
      if (ref_dict->key[lVar2] == key) {
        *location = (REF_INT)lVar2;
        return 0;
      }
      lVar2 = lVar2 + 1;
    } while (ref_dict->n != lVar2);
  }
  return 5;
}

Assistant:

REF_FCN REF_STATUS ref_dict_location(REF_DICT ref_dict, REF_INT key,
                                     REF_INT *location) {
  REF_INT i;

  if (10 < ref_dict_n(ref_dict)) {
    return ref_sort_search_int(ref_dict_n(ref_dict), ref_dict->key, key,
                               location);
  } else {
    *location = REF_EMPTY;

    for (i = 0; i < ref_dict_n(ref_dict); i++)
      if (key == ref_dict->key[i]) {
        *location = i;
        return REF_SUCCESS;
      }
  }
  return REF_NOT_FOUND;
}